

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlDumpXMLCatalogNode
               (xmlCatalogEntryPtr catal,xmlNodePtr catalog,xmlDocPtr doc,xmlNsPtr ns,
               xmlCatalogEntryPtr cgroup)

{
  xmlNsType xVar1;
  xmlNsPtr ns_00;
  xmlNodePtr pxVar2;
  xmlNsPtr xns;
  xmlCatalogEntryPtr cur;
  xmlNodePtr node;
  xmlCatalogEntryPtr cgroup_local;
  xmlNsPtr ns_local;
  xmlDocPtr doc_local;
  xmlNodePtr catalog_local;
  xmlCatalogEntryPtr catal_local;
  
  xns = (xmlNsPtr)catal;
LAB_001912a4:
  if (xns == (xmlNsPtr)0x0) {
    return;
  }
  if ((xmlCatalogEntryPtr)xns[1].prefix != cgroup) goto switchD_001912eb_default;
  switch(*(undefined4 *)&xns->prefix) {
  case 0:
    break;
  case 1:
  case 2:
    if ((xmlCatalogEntryPtr)xns != catal) break;
    xns = (xmlNsPtr)xns->href;
    goto LAB_001912a4;
  case 3:
    pxVar2 = xmlNewDocNode(doc,ns,(xmlChar *)"nextCatalog",(xmlChar *)0x0);
    xmlSetProp(pxVar2,"catalog",(xmlChar *)xns->context);
    xmlAddChild(catalog,pxVar2);
    break;
  case 4:
    pxVar2 = xmlNewDocNode(doc,ns,"group",(xmlChar *)0x0);
    xmlSetProp(pxVar2,"id",(xmlChar *)xns->_private);
    if ((xns->context != (_xmlDoc *)0x0) &&
       (ns_00 = xmlSearchNsByHref(doc,pxVar2,(xmlChar *)"http://www.w3.org/XML/1998/namespace"),
       ns_00 != (xmlNsPtr)0x0)) {
      xmlSetNsProp(pxVar2,ns_00,"base",(xmlChar *)xns->context);
    }
    xVar1 = xns[1].type;
    if (xVar1 != 0) {
      if (xVar1 == XML_ELEMENT_NODE) {
        xmlSetProp(pxVar2,(xmlChar *)"prefer",(xmlChar *)"public");
      }
      else if (xVar1 == XML_ATTRIBUTE_NODE) {
        xmlSetProp(pxVar2,(xmlChar *)"prefer","system");
      }
    }
    xmlDumpXMLCatalogNode((xmlCatalogEntryPtr)xns->next,pxVar2,doc,ns,(xmlCatalogEntryPtr)xns);
    xmlAddChild(catalog,pxVar2);
    break;
  case 5:
    pxVar2 = xmlNewDocNode(doc,ns,(xmlChar *)"public",(xmlChar *)0x0);
    xmlSetProp(pxVar2,(xmlChar *)"publicId",(xmlChar *)xns->_private);
    xmlSetProp(pxVar2,"uri",(xmlChar *)xns->context);
    xmlAddChild(catalog,pxVar2);
    break;
  case 6:
    pxVar2 = xmlNewDocNode(doc,ns,"system",(xmlChar *)0x0);
    xmlSetProp(pxVar2,(xmlChar *)"systemId",(xmlChar *)xns->_private);
    xmlSetProp(pxVar2,"uri",(xmlChar *)xns->context);
    xmlAddChild(catalog,pxVar2);
    break;
  case 7:
    pxVar2 = xmlNewDocNode(doc,ns,(xmlChar *)"rewriteSystem",(xmlChar *)0x0);
    xmlSetProp(pxVar2,(xmlChar *)"systemIdStartString",(xmlChar *)xns->_private);
    xmlSetProp(pxVar2,(xmlChar *)"rewritePrefix",(xmlChar *)xns->context);
    xmlAddChild(catalog,pxVar2);
    break;
  case 8:
    pxVar2 = xmlNewDocNode(doc,ns,(xmlChar *)"delegatePublic",(xmlChar *)0x0);
    xmlSetProp(pxVar2,(xmlChar *)"publicIdStartString",(xmlChar *)xns->_private);
    xmlSetProp(pxVar2,"catalog",(xmlChar *)xns->context);
    xmlAddChild(catalog,pxVar2);
    break;
  case 9:
    pxVar2 = xmlNewDocNode(doc,ns,(xmlChar *)"delegateSystem",(xmlChar *)0x0);
    xmlSetProp(pxVar2,(xmlChar *)"systemIdStartString",(xmlChar *)xns->_private);
    xmlSetProp(pxVar2,"catalog",(xmlChar *)xns->context);
    xmlAddChild(catalog,pxVar2);
    break;
  case 10:
    pxVar2 = xmlNewDocNode(doc,ns,"uri",(xmlChar *)0x0);
    xmlSetProp(pxVar2,"name",(xmlChar *)xns->_private);
    xmlSetProp(pxVar2,"uri",(xmlChar *)xns->context);
    xmlAddChild(catalog,pxVar2);
    break;
  case 0xb:
    pxVar2 = xmlNewDocNode(doc,ns,(xmlChar *)"rewriteURI",(xmlChar *)0x0);
    xmlSetProp(pxVar2,(xmlChar *)"uriStartString",(xmlChar *)xns->_private);
    xmlSetProp(pxVar2,(xmlChar *)"rewritePrefix",(xmlChar *)xns->context);
    xmlAddChild(catalog,pxVar2);
    break;
  case 0xc:
    pxVar2 = xmlNewDocNode(doc,ns,(xmlChar *)"delegateURI",(xmlChar *)0x0);
    xmlSetProp(pxVar2,(xmlChar *)"uriStartString",(xmlChar *)xns->_private);
    xmlSetProp(pxVar2,"catalog",(xmlChar *)xns->context);
    xmlAddChild(catalog,pxVar2);
    break;
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    break;
  case 0xffffffff:
  }
switchD_001912eb_default:
  xns = xns->next;
  goto LAB_001912a4;
}

Assistant:

static void xmlDumpXMLCatalogNode(xmlCatalogEntryPtr catal, xmlNodePtr catalog,
		    xmlDocPtr doc, xmlNsPtr ns, xmlCatalogEntryPtr cgroup) {
    xmlNodePtr node;
    xmlCatalogEntryPtr cur;
    /*
     * add all the catalog entries
     */
    cur = catal;
    while (cur != NULL) {
        if (cur->group == cgroup) {
	    switch (cur->type) {
	        case XML_CATA_REMOVED:
		    break;
	        case XML_CATA_BROKEN_CATALOG:
	        case XML_CATA_CATALOG:
		    if (cur == catal) {
			cur = cur->children;
		        continue;
		    }
		    break;
		case XML_CATA_NEXT_CATALOG:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "nextCatalog", NULL);
		    xmlSetProp(node, BAD_CAST "catalog", cur->value);
		    xmlAddChild(catalog, node);
                    break;
		case XML_CATA_NONE:
		    break;
		case XML_CATA_GROUP:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "group", NULL);
		    xmlSetProp(node, BAD_CAST "id", cur->name);
		    if (cur->value != NULL) {
		        xmlNsPtr xns;
			xns = xmlSearchNsByHref(doc, node, XML_XML_NAMESPACE);
			if (xns != NULL)
			    xmlSetNsProp(node, xns, BAD_CAST "base",
					 cur->value);
		    }
		    switch (cur->prefer) {
			case XML_CATA_PREFER_NONE:
		            break;
			case XML_CATA_PREFER_PUBLIC:
		            xmlSetProp(node, BAD_CAST "prefer", BAD_CAST "public");
			    break;
			case XML_CATA_PREFER_SYSTEM:
		            xmlSetProp(node, BAD_CAST "prefer", BAD_CAST "system");
			    break;
		    }
		    xmlDumpXMLCatalogNode(cur->next, node, doc, ns, cur);
		    xmlAddChild(catalog, node);
	            break;
		case XML_CATA_PUBLIC:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "public", NULL);
		    xmlSetProp(node, BAD_CAST "publicId", cur->name);
		    xmlSetProp(node, BAD_CAST "uri", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_SYSTEM:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "system", NULL);
		    xmlSetProp(node, BAD_CAST "systemId", cur->name);
		    xmlSetProp(node, BAD_CAST "uri", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_REWRITE_SYSTEM:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "rewriteSystem", NULL);
		    xmlSetProp(node, BAD_CAST "systemIdStartString", cur->name);
		    xmlSetProp(node, BAD_CAST "rewritePrefix", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_DELEGATE_PUBLIC:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "delegatePublic", NULL);
		    xmlSetProp(node, BAD_CAST "publicIdStartString", cur->name);
		    xmlSetProp(node, BAD_CAST "catalog", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_DELEGATE_SYSTEM:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "delegateSystem", NULL);
		    xmlSetProp(node, BAD_CAST "systemIdStartString", cur->name);
		    xmlSetProp(node, BAD_CAST "catalog", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_URI:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "uri", NULL);
		    xmlSetProp(node, BAD_CAST "name", cur->name);
		    xmlSetProp(node, BAD_CAST "uri", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_REWRITE_URI:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "rewriteURI", NULL);
		    xmlSetProp(node, BAD_CAST "uriStartString", cur->name);
		    xmlSetProp(node, BAD_CAST "rewritePrefix", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_DELEGATE_URI:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "delegateURI", NULL);
		    xmlSetProp(node, BAD_CAST "uriStartString", cur->name);
		    xmlSetProp(node, BAD_CAST "catalog", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case SGML_CATA_SYSTEM:
		case SGML_CATA_PUBLIC:
		case SGML_CATA_ENTITY:
		case SGML_CATA_PENTITY:
		case SGML_CATA_DOCTYPE:
		case SGML_CATA_LINKTYPE:
		case SGML_CATA_NOTATION:
		case SGML_CATA_DELEGATE:
		case SGML_CATA_BASE:
		case SGML_CATA_CATALOG:
		case SGML_CATA_DOCUMENT:
		case SGML_CATA_SGMLDECL:
		    break;
	    }
        }
	cur = cur->next;
    }
}